

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilsFORTRAN_wrap.cxx
# Opt level: O3

void msleep(int ms)

{
  int iVar1;
  int *piVar2;
  domain_error *this;
  timespec local_20;
  
  if (ms < 0) {
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this,"Invalid sleep time");
    __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if (ms != 0) {
    local_20.tv_sec = (ulong)(uint)ms / 1000;
    local_20.tv_nsec = ((ulong)(uint)ms % 1000) * 1000000;
    do {
      iVar1 = nanosleep(&local_20,&local_20);
      if (iVar1 != -1) {
        return;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return;
}

Assistant:

void msleep(int ms) {
    if (ms < 0)
        throw std::domain_error("Invalid sleep time");
    std::this_thread::sleep_for(std::chrono::milliseconds(ms));
}